

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O1

decNumber_conflict * decNumberFromUInt32(decNumber_conflict *dn,uint32_t uin)

{
  bool bVar1;
  int32_t iVar2;
  ulong uVar3;
  
  dn->bits = '\0';
  dn->digits = 1;
  dn->exponent = 0;
  dn->lsu[0] = 0;
  if (uin != 0) {
    uVar3 = 0;
    do {
      *(short *)((long)dn->lsu + uVar3) = (short)uin + (short)(uin / 1000) * -1000;
      uVar3 = uVar3 + 2;
      bVar1 = 999 < uin;
      uin = uin / 1000;
    } while (bVar1);
    iVar2 = decGetDigits(dn->lsu,(int32_t)(uVar3 >> 1));
    dn->digits = iVar2;
  }
  return dn;
}

Assistant:

decNumber * decNumberFromUInt32(decNumber *dn, uInt uin) {
  Unit *up;				/* work pointer */
  decNumberZero(dn);			/* clean */
  if (uin==0) return dn;		/* [or decGetDigits bad call] */
  for (up=dn->lsu; uin>0; up++) {
    *up=(Unit)(uin%(DECDPUNMAX+1));
    uin=uin/(DECDPUNMAX+1);
    }
  dn->digits=decGetDigits(dn->lsu, up-dn->lsu);
  return dn;
  }